

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Var * __thiscall kratos::Generator::var(Generator *this,Var *v,string *var_name)

{
  uint uVar1;
  Var *this_00;
  
  this_00 = var(this,var_name,v->var_width_,&v->size_,v->is_signed_);
  this_00->explicit_array_ = v->explicit_array_;
  uVar1 = (*(v->super_IRNode)._vptr_IRNode[0x18])(v);
  (*(this_00->super_IRNode)._vptr_IRNode[0x19])(this_00,(ulong)(uVar1 & 0xff));
  Var::copy_meta_data(this_00,this_00,true);
  return this_00;
}

Assistant:

Var &Generator::var(const Var &v, const std::string &var_name) {
    auto &v_ = var(var_name, v.var_width(), v.size(), v.is_signed());
    v_.set_explicit_array(v.explicit_array());
    v_.set_is_packed(v.is_packed());
    // need to copy other definition over
    v_.copy_meta_data(&v_, true);
    return v_;
}